

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

void tagsRemoveFromHash(TidyDocImpl *doc,TidyTagImpl *tags,ctmbstr s)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  DictHash *next;
  DictHash *prev;
  DictHash *p;
  uint h;
  ctmbstr s_local;
  TidyTagImpl *tags_local;
  TidyDocImpl *doc_local;
  
  uVar1 = tagsHash(s);
  next = (DictHash *)0x0;
  prev = tags->hashtab[uVar1];
  while( true ) {
    bVar3 = false;
    if (prev != (DictHash *)0x0) {
      bVar3 = prev->tag != (Dict *)0x0;
    }
    if (!bVar3) break;
    iVar2 = prvTidytmbstrcmp(s,prev->tag->name);
    if (iVar2 == 0) {
      if (next == (DictHash *)0x0) {
        tags->hashtab[uVar1] = prev->next;
      }
      else {
        next->next = prev->next;
      }
      (*doc->allocator->vtbl->free)(doc->allocator,prev);
      return;
    }
    next = prev;
    prev = prev->next;
  }
  return;
}

Assistant:

static void tagsRemoveFromHash( TidyDocImpl* doc, TidyTagImpl* tags, ctmbstr s )
{
    uint h = tagsHash(s);
    DictHash *p, *prev = NULL;
    for (p = tags->hashtab[h]; p && p->tag; p = p->next)
    {
        if (TY_(tmbstrcmp)(s, p->tag->name) == 0)
        {
            DictHash* next = p->next;
            if ( prev )
                prev->next = next;
            else
                tags->hashtab[h] = next;
            TidyDocFree(doc, p);
            return;
        }
        prev = p;
    }
}